

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

void __thiscall cppcms::widgets::checkbox::render_value(checkbox *this,form_context *context)

{
  uint32_t uVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  string local_40;
  
  if ((this->super_base_html_input).field_0x58 == '\x01') {
    uVar1 = context->html_type_;
    poVar2 = form_context::out(context);
    if (uVar1 == 1) {
      pcVar4 = " checked=\"checked\" ";
      lVar3 = 0x13;
    }
    else {
      pcVar4 = " checked ";
      lVar3 = 9;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  }
  poVar2 = form_context::out(context);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"value=\"",7);
  util::escape(&local_40,(string *)&(this->super_base_html_input).field_0x38);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" ",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void checkbox::render_value(form_context &context)
{
	if(value()) {
		if(context.html() == as_xhtml)
			context.out() << " checked=\"checked\" ";
		else
			context.out() << " checked ";
	}
	context.out() << "value=\""<<util::escape(identification_)<<"\" ";
}